

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_type_set_type(parser_info *info)

{
  coda_type *type_00;
  coda_type *type;
  parser_info *info_local;
  
  type_00 = (coda_type *)info->node->parent->data;
  if (type_00->description != (char *)0x0) {
    coda_type_set_description((coda_type *)info->node->data,type_00->description);
  }
  if (type_00->attributes != (coda_type_record *)0x0) {
    if (*(long *)((long)info->node->data + 0x30) != 0) {
      __assert_fail("((coda_type *)info->node->data)->attributes == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0xe4a,"int cd_type_set_type(parser_info *)");
    }
    *(coda_type_record **)((long)info->node->data + 0x30) = type_00->attributes;
    type_set_format((coda_type *)type_00->attributes,*info->node->data);
    type_00->attributes = (coda_type_record *)0x0;
  }
  coda_type_release(type_00);
  info->node->parent->data = info->node->data;
  info->node->data = (void *)0x0;
  return 0;
}

Assistant:

static int cd_type_set_type(parser_info *info)
{
    coda_type *type;

    type = (coda_type *)info->node->parent->data;
    if (type->description != NULL)
    {
        coda_type_set_description((coda_type *)info->node->data, type->description);
    }
    if (type->attributes != NULL)
    {
        assert(((coda_type *)info->node->data)->attributes == NULL);
        ((coda_type *)info->node->data)->attributes = type->attributes;
        /* update format of attributes to that of new type */
        type_set_format((coda_type *)type->attributes, ((coda_type *)info->node->data)->format);
        type->attributes = NULL;
    }
    coda_type_release(type);
    info->node->parent->data = info->node->data;
    info->node->data = NULL;

    return 0;
}